

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

void __thiscall crnlib::crn_comp::optimize_color_selectors(crn_comp *this)

{
  uint *puVar1;
  uint16 i;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint min_error;
  uint uVar5;
  uint16 i_2;
  uint uVar6;
  ulong uVar7;
  vector<unsigned_short> indices;
  vector<unsigned_int> selectors;
  uint8 D4 [256];
  uint8 D8 [65536];
  elemental_vector eStack_10178;
  vector<unsigned_short> *pvStack_10168;
  ulong uStack_10160;
  elemental_vector eStack_10158;
  crn_comp *pcStack_10148;
  unsigned_short *puStack_10140;
  char acStack_10138 [256];
  byte abStack_10038 [65544];
  
  pvStack_10168 = this->m_selector_remaping;
  uVar5 = (this->m_color_selectors).m_size;
  uStack_10160 = (ulong)uVar5;
  uVar4 = this->m_selector_remaping[0].m_size;
  uVar6 = uVar5 & 0xffff;
  uVar3 = uVar5 & 0xffff;
  if (uVar4 != (uVar5 & 0xffff)) {
    if (uVar4 <= (uVar5 & 0xffff)) {
      if (this->m_selector_remaping[0].m_capacity < uVar3) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)pvStack_10168,uVar6,uVar4 + 1 == uVar3,2,(object_mover)0x0,
                   false);
      }
      uVar4 = this->m_selector_remaping[0].m_size;
      memset(this->m_selector_remaping[0].m_p + uVar4,0,(ulong)(uVar6 - uVar4) * 2);
    }
    this->m_selector_remaping[0].m_size = uVar6;
  }
  uVar2 = 0;
  do {
    acStack_10138[uVar2] =
         (&DAT_001abddc)[(uint)(uVar2 >> 2) & 3 ^ (uint)(uVar2 >> 6) & 0x3ffffff] +
         (&DAT_001abddc)[((uint)(uVar2 >> 4) & 0xfffffff ^ (uint)uVar2) & 3];
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x100);
  uVar2 = 0;
  do {
    uVar4 = (uint)(uVar2 >> 4);
    abStack_10038[uVar2] =
         acStack_10138[(uint)uVar2 & 0xf | uVar4 & 0xf0] +
         acStack_10138[uVar4 & 0xf | (uint)(uVar2 >> 8) & 0xf0];
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x10000);
  eStack_10158.m_p = (void *)0x0;
  eStack_10158.m_size = 0;
  eStack_10158.m_capacity = 0;
  if (uVar6 == 0) {
    eStack_10178.m_p = (void *)0x0;
    eStack_10178.m_size = 0;
    eStack_10178.m_capacity = 0;
  }
  else {
    elemental_vector::increase_capacity(&eStack_10158,uVar3,uVar3 == 1,4,(object_mover)0x0,false);
    memset((void *)((eStack_10158._8_8_ & 0xffffffff) * 4 + (long)eStack_10158.m_p),0,
           (ulong)(uVar3 - eStack_10158.m_size) << 2);
    eStack_10158._8_8_ = CONCAT44(eStack_10158.m_capacity,uVar5) & 0xffffffff0000ffff;
    eStack_10178.m_p = (void *)0x0;
    eStack_10178.m_size = 0;
    eStack_10178.m_capacity = 0;
    elemental_vector::increase_capacity(&eStack_10178,uVar3,uVar3 == 1,2,(object_mover)0x0,false);
    memset((void *)((eStack_10178._8_8_ & 0xffffffff) * 2 + (long)eStack_10178.m_p),0,
           (ulong)(uVar3 - eStack_10178.m_size) * 2);
    eStack_10178._8_8_ = CONCAT44(eStack_10178.m_capacity,uVar5) & 0xffffffff0000ffff;
  }
  if (uVar3 != 0) {
    puVar1 = (this->m_color_selectors).m_p;
    uVar2 = 0;
    do {
      *(uint *)((long)eStack_10158.m_p + uVar2 * 4) = puVar1[uVar2];
      *(short *)((long)eStack_10178.m_p + uVar2 * 2) = (short)uVar2;
      uVar2 = uVar2 + 1;
    } while ((ushort)uVar5 != uVar2);
  }
  if ((short)uStack_10160 != 0) {
    puStack_10140 = pvStack_10168->m_p;
    uVar2 = uStack_10160 & 0xffff;
    uVar5 = 0;
    do {
      uVar6 = 0xffffffff;
      uVar7 = 0;
      uVar4 = 0;
      do {
        uVar3 = *(uint *)((long)eStack_10158.m_p + uVar7 * 4);
        uVar3 = (uint)abStack_10038[(uVar3 & 0xff) << 8 | uVar5 & 0xff] +
                (uint)abStack_10038[uVar3 & 0xff00 | uVar5 >> 8 & 0xff] +
                (uint)abStack_10038[uVar3 >> 8 & 0xff00 | uVar5 >> 0x10 & 0xff] +
                (uint)abStack_10038[uVar3 >> 0x10 & 0xff00 | uVar5 >> 0x18];
        if (uVar3 < uVar6) {
          uVar6 = uVar3;
          uVar4 = (uint)uVar7;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar2);
      uVar7 = (ulong)(uVar4 & 0xffff);
      uVar5 = *(uint *)((long)eStack_10158.m_p + uVar7 * 4);
      puStack_10140[*(ushort *)((long)eStack_10178.m_p + uVar7 * 2)] =
           (short)uStack_10160 - (short)uVar2;
      *(undefined4 *)((long)eStack_10158.m_p + uVar7 * 4) =
           *(undefined4 *)((long)eStack_10158.m_p + uVar2 * 4 + -4);
      *(undefined2 *)((long)eStack_10178.m_p + uVar7 * 2) =
           *(undefined2 *)((long)eStack_10178.m_p + uVar2 * 2 + -2);
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  pcStack_10148 = this;
  pack_color_selectors(this,&this->m_packed_color_selectors,pvStack_10168);
  if (eStack_10178.m_p != (void *)0x0) {
    crnlib_free(eStack_10178.m_p);
  }
  if (eStack_10158.m_p != (void *)0x0) {
    crnlib_free(eStack_10158.m_p);
  }
  return;
}

Assistant:

void crn_comp::optimize_color_selectors()
    {
        crnlib::vector<uint16>& remapping = m_selector_remaping[cColor];
        uint16 n = m_color_selectors.size();
        remapping.resize(n);

        uint8 d[] = { 0, 5, 14, 10 };

        uint8 D4[0x100];
        for (uint16 i = 0; i < 0x100; i++)
        {
            D4[i] = d[(i ^ i >> 4) & 3] + d[(i >> 2 ^ i >> 6) & 3];
        }
        uint8 D8[0x10000];
        for (uint32 i = 0; i < 0x10000; i++)
        {
            D8[i] = D4[(i >> 8 & 0xF0) | (i >> 4 & 0xF)] + D4[(i >> 4 & 0xF0) | (i & 0xF)];
        }

        crnlib::vector<uint32> selectors(n);
        crnlib::vector<uint16> indices(n);
        for (uint16 i = 0; i < n; i++)
        {
            selectors[i] = m_color_selectors[i];
            indices[i] = i;
        }
        uint32 selected_selector = 0;
        for (uint16 left = n; left;)
        {
            uint16 selected_index = 0;
            uint min_error = cUINT32_MAX;
            for (uint16 i = 0; i < left; i++)
            {
                uint32 selector = selectors[i];
                uint8 d0 = D8[(selector >> 16 & 0xFF00) | (selected_selector >> 24 & 0xFF)];
                uint8 d1 = D8[(selector >> 8 & 0xFF00) | (selected_selector >> 16 & 0xFF)];
                uint8 d2 = D8[(selector & 0xFF00) | (selected_selector >> 8 & 0xFF)];
                uint8 d3 = D8[(selector << 8 & 0xFF00) | (selected_selector & 0xFF)];
                uint error = d0 + d1 + d2 + d3;
                if (error < min_error)
                {
                    min_error = error;
                    selected_index = i;
                }
            }
            selected_selector = selectors[selected_index];
            remapping[indices[selected_index]] = n - left;
            left--;
            selectors[selected_index] = selectors[left];
            indices[selected_index] = indices[left];
        }

        pack_color_selectors(m_packed_color_selectors, remapping);
    }